

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pthread.cc
# Opt level: O2

void * gutil::anon_unknown_0::ptfct(void *fa)

{
  undefined8 *puVar1;
  
  if (*(undefined8 **)((long)fa + 0x10) != (undefined8 *)0x0) {
    (**(code **)**(undefined8 **)((long)fa + 0x10))();
  }
  puVar1 = *(undefined8 **)((long)fa + 0x18);
  if (puVar1 != (undefined8 *)0x0) {
    (**(code **)*puVar1)
              (puVar1,*(undefined8 *)((long)fa + 0x20),*(undefined8 *)((long)fa + 0x28),
               *(undefined8 *)((long)fa + 0x30));
  }
  return (void *)0x0;
}

Assistant:

void *ptfct(void *fa)
{
  ThreadData *p=reinterpret_cast<ThreadData *>(fa);

  if (p->tfct != 0)
  {
    p->tfct->run();
  }

  if (p->pfct != 0)
  {
    p->pfct->run(p->start, p->end, p->step);
  }

  return 0;
}